

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pool_impl.cpp
# Opt level: O0

FileHandle __thiscall
libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::open_file
          (file_pool_impl<libtorrent::aux::file_view_entry> *this,storage_index_t st,string *p,
          file_index_t file_index,file_storage *fs,open_mode_t m)

{
  anon_class_16_2_6e076f23 mod;
  bool bVar1;
  ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_boost::multi_index::detail::nth_layer<1,_libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  *this_00;
  pointer poVar2;
  type position;
  iterator i_00;
  size_type sVar3;
  type *ptVar4;
  file_view_entry *pfVar5;
  undefined4 in_register_0000000c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  file_pool_impl<libtorrent::aux::file_view_entry> *this_01;
  undefined4 in_register_0000008c;
  pair<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_bool>
  pVar6;
  FileHandle FVar7;
  anon_class_16_2_1bc33e9c_for__M_pred __pred;
  bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void> in_stack_00000008;
  byte local_40a;
  bool local_3d6;
  bool local_3d5;
  byte local_3d1;
  storage_error *se;
  bad_alloc *anon_var_1;
  system_error *se_1;
  storage_error local_2b8;
  shared_ptr<libtorrent::aux::file_mapping> local_2a0;
  sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
  *local_290;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>
  *local_288;
  iterator local_280;
  sequenced_index<boost::multi_index::detail::nth_layer<2,_libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>,_boost::mpl::vector0<mpl_::na>_>
  *local_278;
  type *lru_view_1;
  file_view_entry *local_268;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>
  *local_260;
  undefined4 local_258;
  uint local_254;
  uint local_250 [3];
  uint local_244;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>
  local_240 [2];
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>
  *local_230;
  undefined1 local_228;
  pair<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_bool>
  local_220;
  byte local_209;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>
  *poStack_208;
  bool added;
  int local_1fc;
  undefined1 local_1f8 [8];
  file_view_entry e;
  opening_file_entry ofe;
  type *lru_view;
  uint local_150 [3];
  uint local_144;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>
  local_140;
  undefined4 local_134;
  undefined1 local_130 [8];
  wait_open_entry woe;
  undefined1 local_b0 [16];
  list_iterator<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>,_false>
  local_a0;
  list_iterator<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>,_false>
  opening;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>
  local_90;
  iterator i;
  file_id file_key;
  type *key_view;
  undefined1 local_68 [8];
  unique_lock<std::mutex> l;
  FileHandle defer_destruction2;
  FileHandle defer_destruction1;
  file_storage *fs_local;
  string *p_local;
  file_pool_impl<libtorrent::aux::file_view_entry> *this_local;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_18;
  open_mode_t m_local;
  file_index_t file_index_local;
  storage_index_t st_local;
  
  this_01 = (file_pool_impl<libtorrent::aux::file_view_entry> *)
            CONCAT44(in_register_00000034,st.m_val);
  m_local.m_val = (uint)p;
  local_18.m_val = (int)fs;
  ::std::shared_ptr<libtorrent::aux::file_mapping>::shared_ptr
            ((shared_ptr<libtorrent::aux::file_mapping> *)
             &defer_destruction2.
              super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::shared_ptr<libtorrent::aux::file_mapping>::shared_ptr
            ((shared_ptr<libtorrent::aux::file_mapping> *)&l._M_owns);
  ::std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_68,&this_01->m_mutex)
  ;
  this_00 = &boost::multi_index::
             multi_index_container<libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>
             ::get<0>(&this_01->m_files)->super_type;
  ::std::
  pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  ::
  pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>_&,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_&,_true>
            ((pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
              *)&i,(strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void> *)&m_local,
             &local_18);
  local_90.node =
       (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>
        *)boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,boost::multi_index::detail::nth_layer<1,libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::
          find<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>
                    ((ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,boost::multi_index::detail::nth_layer<1,libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)this_00,
                     (pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                      *)&i);
  opening.members_.nodeptr_ =
       (iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>_*,_false>
        )boost::multi_index::detail::
         ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_boost::multi_index::detail::nth_layer<1,_libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
         ::end(this_00);
  bVar1 = boost::multi_index::detail::operator==
                    (&local_90,
                     (bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>
                      *)&opening);
  if (bVar1) {
    boost::intrusive::
    list_impl<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>,_unsigned_long,_true,_void>
    ::begin((list_impl<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>,_unsigned_long,_true,_void>
             *)(local_b0 + 8));
    boost::intrusive::
    list_impl<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>,_unsigned_long,_true,_void>
    ::end((list_impl<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>,_unsigned_long,_true,_void>
           *)local_b0);
    __pred._8_8_ = &i;
    __pred.file_key = (file_id *)local_b0;
    ::std::
    find_if<boost::intrusive::list_iterator<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>,false>,libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::open_file(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,std::__cxx11::string_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::file_storage_const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::aux::open_mode_tag,void>)::_lambda(libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry_const&)_1_>
              (&local_a0,
               (list_iterator<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>,_false>
                *)(local_b0 + 8),__pred);
    boost::intrusive::
    list_impl<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>,_unsigned_long,_true,_void>
    ::end((list_impl<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>,_unsigned_long,_true,_void>
           *)&woe.error.field_0x10);
    bVar1 = boost::intrusive::operator!=
                      (&local_a0,
                       (list_iterator<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>,_false>
                        *)&woe.error.field_0x10);
    if (bVar1) {
      wait_open_entry::wait_open_entry((wait_open_entry *)local_130);
      poVar2 = boost::intrusive::
               list_iterator<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>,_false>
               ::operator->(&local_a0);
      boost::intrusive::
      list_impl<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::wait_open_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::wait_open_entry::list_hook>,_unsigned_long,_true,_void>
      ::push_back(&(poVar2->waiters).super_type,(reference)local_130);
      do {
        ::std::condition_variable::wait((unique_lock *)&woe.list_hook.super_type.super_type.prev_);
        bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&woe.field_0x38);
        local_3d1 = 0;
        if (!bVar1) {
          bVar1 = storage_error::operator_cast_to_bool
                            ((storage_error *)
                             &woe.mapping.
                              super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
          local_3d1 = bVar1 ^ 0xff;
        }
      } while ((local_3d1 & 1) != 0);
      bVar1 = storage_error::operator_cast_to_bool
                        ((storage_error *)
                         &woe.mapping.
                          super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
      if (bVar1) {
        throw_ex<libtorrent::storage_error,libtorrent::storage_error&>
                  ((storage_error *)
                   &woe.mapping.
                    super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      ::std::shared_ptr<libtorrent::aux::file_mapping>::shared_ptr
                ((shared_ptr<libtorrent::aux::file_mapping> *)this,
                 (shared_ptr<libtorrent::aux::file_mapping> *)&woe.field_0x38);
      local_134 = 1;
      wait_open_entry::~wait_open_entry((wait_open_entry *)local_130);
      goto LAB_002d89b9;
    }
  }
  local_140.node =
       (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>
        *)boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_boost::multi_index::detail::nth_layer<1,_libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
          ::end(this_00);
  bVar1 = boost::operators_impl::operator!=(&local_90,&local_140);
  local_3d5 = false;
  if (bVar1) {
    local_150[1] = 1;
    local_144 = (uint)libtorrent::flags::operator&
                                (in_stack_00000008,
                                 (bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void>)
                                 0x1);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_144);
    local_3d6 = true;
    if (bVar1) {
      pfVar5 = boost::operators_impl::
               dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_const_libtorrent::aux::file_view_entry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_libtorrent::aux::file_view_entry,_long,_const_libtorrent::aux::file_view_entry_*,_const_libtorrent::aux::file_view_entry_&>_>_>
               ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_const_libtorrent::aux::file_view_entry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_libtorrent::aux::file_view_entry,_long,_const_libtorrent::aux::file_view_entry_*,_const_libtorrent::aux::file_view_entry_&>_>_>
                             *)&local_90);
      local_150[0] = (uint)libtorrent::flags::operator&
                                     ((bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void>
                                       )(pfVar5->mode).m_val,
                                      (bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void>
                                       )0x1);
      local_3d6 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                            ((bitfield_flag *)local_150);
    }
    local_3d5 = local_3d6;
  }
  if (local_3d5 == false) {
    sVar3 = boost::multi_index::detail::
            ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_boost::multi_index::detail::nth_layer<1,_libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
            ::size(&(this_01->m_files).super_type.super_type);
    if (this_01->m_size + -1 <= (int)sVar3) {
      remove_oldest((file_pool_impl<libtorrent::aux::file_view_entry> *)
                    ((long)&ofe.waiters.super_type.data_.root_plus_size_.m_header.super_node + 8),
                    (unique_lock<std::mutex> *)this_01);
      ::std::shared_ptr<libtorrent::aux::file_mapping>::operator=
                ((shared_ptr<libtorrent::aux::file_mapping> *)
                 &defer_destruction2.
                  super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (shared_ptr<libtorrent::aux::file_mapping> *)
                 ((long)&ofe.waiters.super_type.data_.root_plus_size_.m_header.super_node + 8));
      ::std::shared_ptr<libtorrent::aux::file_mapping>::~shared_ptr
                ((shared_ptr<libtorrent::aux::file_mapping> *)
                 ((long)&ofe.waiters.super_type.data_.root_plus_size_.m_header.super_node + 8));
    }
    opening_file_entry::opening_file_entry((opening_file_entry *)&e.mode);
    ::std::
    pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
    ::operator=((pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                 *)&ofe.list_hook.super_type.super_type.prev_,(type)&i);
    boost::intrusive::
    list_impl<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>,_unsigned_long,_true,_void>
    ::push_back(&(this_01->m_opening_files).super_type,(reference)&e.mode);
    ::std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_68);
    local_1fc = local_18.m_val;
    poStack_208 = i.node;
    open_file_impl((file_view_entry *)local_1f8,this_01,
                   (string *)CONCAT44(in_register_0000000c,file_index.m_val),
                   (file_index_t)local_18.m_val,
                   (file_storage *)CONCAT44(in_register_0000008c,m.m_val),
                   (open_mode_t)in_stack_00000008.m_val,(file_id)i.node);
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
    pVar6 = boost::multi_index::detail::
            ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_boost::multi_index::detail::nth_layer<1,_libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
            ::insert(this_00,(value_type *)local_1f8);
    local_230 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>
                 *)pVar6.first.node;
    local_228 = pVar6.second;
    local_220.first.node = local_230;
    local_220.second = (bool)local_228;
    ::std::
    tie<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,std::allocator<libtorrent::aux::file_view_entry>>>>>,bool>
              (local_240,(bool *)&local_90);
    ::std::
    tuple<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,std::allocator<libtorrent::aux::file_view_entry>>>>>&,bool&>
    ::operator=((tuple<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,std::allocator<libtorrent::aux::file_view_entry>>>>>&,bool&>
                 *)local_240,&local_220);
    if ((local_209 & 1) == 0) {
      local_250[1] = 1;
      local_244 = (uint)libtorrent::flags::operator&
                                  (in_stack_00000008,
                                   (bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void>
                                    )0x1);
      bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_244);
      local_40a = 0;
      if (bVar1) {
        pfVar5 = boost::operators_impl::
                 dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_const_libtorrent::aux::file_view_entry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_libtorrent::aux::file_view_entry,_long,_const_libtorrent::aux::file_view_entry_*,_const_libtorrent::aux::file_view_entry_&>_>_>
                 ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_const_libtorrent::aux::file_view_entry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_libtorrent::aux::file_view_entry,_long,_const_libtorrent::aux::file_view_entry_*,_const_libtorrent::aux::file_view_entry_&>_>_>
                               *)&local_90);
        local_254 = (pfVar5->mode).m_val;
        local_258 = 1;
        local_250[0] = (uint)libtorrent::flags::operator&
                                       ((bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void>
                                         )local_254,
                                        (bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void>
                                         )0x1);
        bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)local_250);
        local_40a = bVar1 ^ 0xff;
      }
      if ((local_40a & 1) != 0) {
        local_260 = local_90.node;
        lru_view_1 = (type *)&l._M_owns;
        local_268 = (file_view_entry *)local_1f8;
        mod.e = local_268;
        mod.defer_destruction2 = (FileHandle *)lru_view_1;
        boost::multi_index::detail::
        ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,boost::multi_index::detail::nth_layer<1,libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
        ::
        modify<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::open_file(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,std::__cxx11::string_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::file_storage_const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::aux::open_mode_tag,void>)::_lambda(libtorrent::aux::file_view_entry&)_2_>
                  ((ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,boost::multi_index::detail::nth_layer<1,libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                    *)this_00,(iterator)local_90.node,mod);
      }
      ptVar4 = boost::multi_index::
               multi_index_container<libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>
               ::get<1>(&this_01->m_files);
      local_288 = local_90.node;
      local_278 = ptVar4;
      local_280.node =
           (sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
            *)boost::multi_index::
              multi_index_container<libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>
              ::
              project<1,boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,std::allocator<libtorrent::aux::file_view_entry>>>>>>
                        ((multi_index_container<libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>
                          *)&this_01->m_files,local_90);
      local_290 = (sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                   *)boost::multi_index::detail::
                     sequenced_index<boost::multi_index::detail::nth_layer<2,_libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>,_boost::mpl::vector0<mpl_::na>_>
                     ::begin(local_278);
      boost::multi_index::detail::
      sequenced_index<boost::multi_index::detail::nth_layer<2,_libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>,_boost::mpl::vector0<mpl_::na>_>
      ::relocate(ptVar4,local_280,(iterator)local_290);
    }
    pfVar5 = boost::operators_impl::
             dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_const_libtorrent::aux::file_view_entry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_libtorrent::aux::file_view_entry,_long,_const_libtorrent::aux::file_view_entry_*,_const_libtorrent::aux::file_view_entry_&>_>_>
             ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_const_libtorrent::aux::file_view_entry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_libtorrent::aux::file_view_entry,_long,_const_libtorrent::aux::file_view_entry_*,_const_libtorrent::aux::file_view_entry_&>_>_>
                           *)&local_90);
    ::std::shared_ptr<libtorrent::aux::file_mapping>::shared_ptr(&local_2a0,&pfVar5->mapping);
    storage_error::storage_error(&local_2b8);
    notify_file_open(this_01,(opening_file_entry *)&e.mode,&local_2a0,&local_2b8);
    ::std::shared_ptr<libtorrent::aux::file_mapping>::~shared_ptr(&local_2a0);
    pfVar5 = boost::operators_impl::
             dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_const_libtorrent::aux::file_view_entry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_libtorrent::aux::file_view_entry,_long,_const_libtorrent::aux::file_view_entry_*,_const_libtorrent::aux::file_view_entry_&>_>_>
             ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_const_libtorrent::aux::file_view_entry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_libtorrent::aux::file_view_entry,_long,_const_libtorrent::aux::file_view_entry_*,_const_libtorrent::aux::file_view_entry_&>_>_>
                           *)&local_90);
    ::std::shared_ptr<libtorrent::aux::file_mapping>::shared_ptr
              ((shared_ptr<libtorrent::aux::file_mapping> *)this,&pfVar5->mapping);
    local_134 = 1;
    file_view_entry::~file_view_entry((file_view_entry *)local_1f8);
    opening_file_entry::~opening_file_entry((opening_file_entry *)&e.mode);
  }
  else {
    boost::multi_index::detail::
    ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,boost::multi_index::detail::nth_layer<1,libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
    ::
    modify<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::open_file(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,std::__cxx11::string_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::file_storage_const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::aux::open_mode_tag,void>)::_lambda(libtorrent::aux::file_view_entry&)_1_>
              ((ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,boost::multi_index::detail::nth_layer<1,libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                *)this_00,local_90.node);
    ptVar4 = boost::multi_index::
             multi_index_container<libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>
             ::get<1>(&this_01->m_files);
    position = boost::multi_index::
               multi_index_container<libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>
               ::
               project<1,boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,std::allocator<libtorrent::aux::file_view_entry>>>>>>
                         ((multi_index_container<libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>
                           *)&this_01->m_files,local_90);
    i_00 = boost::multi_index::detail::
           sequenced_index<boost::multi_index::detail::nth_layer<2,_libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>,_boost::mpl::vector0<mpl_::na>_>
           ::begin(ptVar4);
    boost::multi_index::detail::
    sequenced_index<boost::multi_index::detail::nth_layer<2,_libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>,_boost::mpl::vector0<mpl_::na>_>
    ::relocate(ptVar4,(iterator)position.node,i_00);
    pfVar5 = boost::operators_impl::
             dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_const_libtorrent::aux::file_view_entry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_libtorrent::aux::file_view_entry,_long,_const_libtorrent::aux::file_view_entry_*,_const_libtorrent::aux::file_view_entry_&>_>_>
             ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_const_libtorrent::aux::file_view_entry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_libtorrent::aux::file_view_entry,_long,_const_libtorrent::aux::file_view_entry_*,_const_libtorrent::aux::file_view_entry_&>_>_>
                           *)&local_90);
    ::std::shared_ptr<libtorrent::aux::file_mapping>::shared_ptr
              ((shared_ptr<libtorrent::aux::file_mapping> *)this,&pfVar5->mapping);
    local_134 = 1;
  }
LAB_002d89b9:
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
  ::std::shared_ptr<libtorrent::aux::file_mapping>::~shared_ptr
            ((shared_ptr<libtorrent::aux::file_mapping> *)&l._M_owns);
  ::std::shared_ptr<libtorrent::aux::file_mapping>::~shared_ptr
            ((shared_ptr<libtorrent::aux::file_mapping> *)
             &defer_destruction2.
              super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  FVar7.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  FVar7.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (FileHandle)
         FVar7.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

typename file_pool_impl<FileEntry>::FileHandle
	file_pool_impl<FileEntry>::open_file(storage_index_t st, std::string const& p
		, file_index_t const file_index, file_storage const& fs
		, open_mode_t const m
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
		, std::shared_ptr<std::mutex> open_unmap_lock
#endif
		)
	{
		// potentially used to hold a reference to a file object that's
		// about to be destructed. If we have such object we assign it to
		// this member to be destructed after we release the std::mutex. On some
		// operating systems (such as OSX) closing a file may take a long
		// time. We don't want to hold the std::mutex for that.
		FileHandle defer_destruction1;
		FileHandle defer_destruction2;

		std::unique_lock<std::mutex> l(m_mutex);

		TORRENT_ASSERT(is_complete(p));
		auto& key_view = m_files.template get<0>();
		file_id const file_key{st, file_index};
		auto i = key_view.find(file_key);

		if (i == key_view.end())
		{
			auto opening = std::find_if(m_opening_files.begin(), m_opening_files.end()
				, [&file_key, m](opening_file_entry const& oe) {
					return oe.file_key == file_key
						&& (!(m & open_mode::write) || (oe.mode & open_mode::write));
				});
			if (opening != m_opening_files.end())
			{
				wait_open_entry woe;
				opening->waiters.push_back(woe);

#if TRACE_FILE_POOL
				std::cout << std::this_thread::get_id() << " waiting for: ("
					<< file_key.first << ", " << file_key.second << ")\n";
#endif
				do {
					woe.cond.wait(l);
				} while (!woe.mapping && !woe.error);
				if (woe.error)
				{
#if TRACE_FILE_POOL
					std::cout << std::this_thread::get_id() << " open failed: ("
						<< file_key.first << ", " << file_key.second
						<< "): " << woe.error.ec << std::endl;
#endif
					throw_ex<storage_error>(woe.error);
				}

#if TRACE_FILE_POOL
				std::cout << std::this_thread::get_id() << " file opened: ("
					<< file_key.first << ", " << file_key.second << ")\n";
#endif
				return woe.mapping;
			}
		}

		// make sure the write bit is set if we asked for it
		// it's OK to use a read-write file if we just asked for read. But if
		// we asked for write, the file we serve back must be opened in write
		// mode
		if (i != key_view.end()
			&& (!(m & open_mode::write) || (i->mode & open_mode::write)))
		{
			key_view.modify(i, [&](FileEntry& e)
			{
				e.last_use = aux::time_now();
			});

			auto& lru_view = m_files. template get<1>();
			lru_view.relocate(m_files. template project<1>(i), lru_view.begin());

			return i->mapping;
		}

		if (int(m_files.size()) >= m_size - 1)
		{
			// the file cache is at its maximum size, close
			// the least recently used file
			defer_destruction1 = remove_oldest(l);
		}

		opening_file_entry ofe;
		ofe.file_key = file_key;
		ofe.mode = m;
		m_opening_files.push_back(ofe);

#if TRACE_FILE_POOL
		std::cout << std::this_thread::get_id() << " opening file: ("
			<< file_key.first << ", " << file_key.second << ")\n";
#endif

		l.unlock();

		try
		{
			FileEntry e = open_file_impl(p, file_index, fs, m, file_key
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
				, open_unmap_lock
#endif
				);

			l.lock();

			// there's an edge case where two threads are racing to insert a newly
			// opened file, one thread is opening a file for writing and the other
			// fore reading. If the reading thread wins, it's important that the
			// thread opening for writing still overwrites the file in the pool,
			// since a file opened for reading and writing can be used for both.
			// So, we can't move e in here, because we may need it again of the
			// insertion failed.
			// if the insertion failed, check to see if we can use the existing
			// entry. If not, overwrite it with the newly opened file ``e``.
			bool added;
			std::tie(i, added) = key_view.insert(e);
			if (added == false)
			{
				// this is the case where this file was already in the pool. Make
				// sure we can use it. If we asked for write mode, it must have been
				// opened in write mode too.
				TORRENT_ASSERT(i != key_view.end());

				if ((m & open_mode::write) && !(i->mode & open_mode::write))
				{
					key_view.modify(i, [&](FileEntry& fe)
					{
						defer_destruction2 = std::move(fe.mapping);
						fe = std::move(e);
					});
				}

				auto& lru_view = m_files.template get<1>();
				lru_view.relocate(m_files. template project<1>(i), lru_view.begin());
			}
			notify_file_open(ofe, i->mapping, storage_error());
			return i->mapping;
		}
		catch (storage_error const& se)
		{
			if (!l.owns_lock()) l.lock();
			notify_file_open(ofe, {}, se);
			throw;
		}
		catch (std::bad_alloc const&)
		{
			if (!l.owns_lock()) l.lock();
			notify_file_open(ofe, {}, storage_error(
				errors::no_memory, file_index, operation_t::file_open));
			throw;
		}
		catch (boost::system::system_error const& se)
		{
			if (!l.owns_lock()) l.lock();
			notify_file_open(ofe, {}, storage_error(
				se.code(), file_index, operation_t::file_open));
			throw;
		}
		catch (...)
		{
			if (!l.owns_lock()) l.lock();
			notify_file_open(ofe, {}, storage_error(
				errors::no_memory, file_index, operation_t::file_open));
			throw;
		}
	}